

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O3

int mbedtls_ssl_handle_message_type(mbedtls_ssl_context *ssl)

{
  uchar *puVar1;
  int iVar2;
  uint uVar3;
  char *format;
  
  iVar2 = ssl->in_msgtype;
  if (iVar2 == 0x16) {
    iVar2 = mbedtls_ssl_prepare_handshake_record(ssl);
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = ssl->in_msgtype;
  }
  if (iVar2 != 0x15) {
    if (iVar2 == 0x14) {
      if (ssl->in_msglen != 1) {
        format = "invalid CCS message, len: %zu";
        iVar2 = 0x1372;
        goto LAB_001a0328;
      }
      if (*ssl->in_msg != '\x01') {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0x1378,"invalid CCS message, content: %02x");
        return -0x7200;
      }
      if (ssl->conf->transport != '\x01') {
        return 0;
      }
      if ((ssl->state != 10) && (ssl->state != 0xc)) {
        if (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                     ,0x1381,"dropping ChangeCipherSpec outside handshake");
          return -0x6700;
        }
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0x1385,"received out-of-order ChangeCipherSpec - remember");
        return -0x6480;
      }
    }
    else {
      if (ssl->conf->transport != '\x01') {
        return 0;
      }
      if ((iVar2 == 0x17) && (ssl->state < 0x1b)) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0x13cc,"dropping unexpected ApplicationData");
        return -0x6680;
      }
    }
    if (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) {
      return 0;
    }
    if (0x1a < ssl->state) {
      mbedtls_ssl_handshake_wrapup_free_hs_transform(ssl);
      return 0;
    }
    return 0;
  }
  if (ssl->in_msglen == 2) {
    uVar3 = (uint)ssl->in_msg[1];
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0x13a4,"got an alert message, type: [%u:%u]",(ulong)*ssl->in_msg,uVar3);
    puVar1 = ssl->in_msg;
    if (*puVar1 != '\x01') {
      if (*puVar1 == '\x02') {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0x13ab,"is a fatal alert message (msg %d)",(ulong)puVar1[1],uVar3);
        return -0x7780;
      }
      return -0x6680;
    }
    if (puVar1[1] != 'd') {
      if (puVar1[1] == '\0') {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0x13b1,"is a close notify message");
        return -0x7880;
      }
      return -0x6680;
    }
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0x13b8,"is a no renegotiation alert");
    return 0;
  }
  format = "invalid alert message, len: %zu";
  iVar2 = 0x139f;
LAB_001a0328:
  mbedtls_debug_print_msg
            (ssl,1,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,iVar2,format);
  return -0x7200;
}

Assistant:

int mbedtls_ssl_handle_message_type(mbedtls_ssl_context *ssl)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    /*
     * Handle particular types of records
     */
    if (ssl->in_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE) {
        if ((ret = mbedtls_ssl_prepare_handshake_record(ssl)) != 0) {
            return ret;
        }
    }

    if (ssl->in_msgtype == MBEDTLS_SSL_MSG_CHANGE_CIPHER_SPEC) {
        if (ssl->in_msglen != 1) {
            MBEDTLS_SSL_DEBUG_MSG(1, ("invalid CCS message, len: %" MBEDTLS_PRINTF_SIZET,
                                      ssl->in_msglen));
            return MBEDTLS_ERR_SSL_INVALID_RECORD;
        }

        if (ssl->in_msg[0] != 1) {
            MBEDTLS_SSL_DEBUG_MSG(1, ("invalid CCS message, content: %02x",
                                      ssl->in_msg[0]));
            return MBEDTLS_ERR_SSL_INVALID_RECORD;
        }

#if defined(MBEDTLS_SSL_PROTO_DTLS)
        if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
            ssl->state != MBEDTLS_SSL_CLIENT_CHANGE_CIPHER_SPEC    &&
            ssl->state != MBEDTLS_SSL_SERVER_CHANGE_CIPHER_SPEC) {
            if (ssl->handshake == NULL) {
                MBEDTLS_SSL_DEBUG_MSG(1, ("dropping ChangeCipherSpec outside handshake"));
                return MBEDTLS_ERR_SSL_UNEXPECTED_RECORD;
            }

            MBEDTLS_SSL_DEBUG_MSG(1, ("received out-of-order ChangeCipherSpec - remember"));
            return MBEDTLS_ERR_SSL_EARLY_MESSAGE;
        }
#endif

#if defined(MBEDTLS_SSL_PROTO_TLS1_3)
        if (ssl->tls_version == MBEDTLS_SSL_VERSION_TLS1_3) {
#if defined(MBEDTLS_SSL_TLS1_3_COMPATIBILITY_MODE)
            MBEDTLS_SSL_DEBUG_MSG(1,
                                  ("Ignore ChangeCipherSpec in TLS 1.3 compatibility mode"));
            return MBEDTLS_ERR_SSL_CONTINUE_PROCESSING;
#else
            MBEDTLS_SSL_DEBUG_MSG(1,
                                  ("ChangeCipherSpec invalid in TLS 1.3 without compatibility mode"));
            return MBEDTLS_ERR_SSL_INVALID_RECORD;
#endif /* MBEDTLS_SSL_TLS1_3_COMPATIBILITY_MODE */
        }
#endif /* MBEDTLS_SSL_PROTO_TLS1_3 */
    }

    if (ssl->in_msgtype == MBEDTLS_SSL_MSG_ALERT) {
        if (ssl->in_msglen != 2) {
            /* Note: Standard allows for more than one 2 byte alert
               to be packed in a single message, but Mbed TLS doesn't
               currently support this. */
            MBEDTLS_SSL_DEBUG_MSG(1, ("invalid alert message, len: %" MBEDTLS_PRINTF_SIZET,
                                      ssl->in_msglen));
            return MBEDTLS_ERR_SSL_INVALID_RECORD;
        }

        MBEDTLS_SSL_DEBUG_MSG(2, ("got an alert message, type: [%u:%u]",
                                  ssl->in_msg[0], ssl->in_msg[1]));

        /*
         * Ignore non-fatal alerts, except close_notify and no_renegotiation
         */
        if (ssl->in_msg[0] == MBEDTLS_SSL_ALERT_LEVEL_FATAL) {
            MBEDTLS_SSL_DEBUG_MSG(1, ("is a fatal alert message (msg %d)",
                                      ssl->in_msg[1]));
            return MBEDTLS_ERR_SSL_FATAL_ALERT_MESSAGE;
        }

        if (ssl->in_msg[0] == MBEDTLS_SSL_ALERT_LEVEL_WARNING &&
            ssl->in_msg[1] == MBEDTLS_SSL_ALERT_MSG_CLOSE_NOTIFY) {
            MBEDTLS_SSL_DEBUG_MSG(2, ("is a close notify message"));
            return MBEDTLS_ERR_SSL_PEER_CLOSE_NOTIFY;
        }

#if defined(MBEDTLS_SSL_RENEGOTIATION_ENABLED)
        if (ssl->in_msg[0] == MBEDTLS_SSL_ALERT_LEVEL_WARNING &&
            ssl->in_msg[1] == MBEDTLS_SSL_ALERT_MSG_NO_RENEGOTIATION) {
            MBEDTLS_SSL_DEBUG_MSG(2, ("is a no renegotiation alert"));
            /* Will be handled when trying to parse ServerHello */
            return 0;
        }
#endif
        /* Silently ignore: fetch new message */
        return MBEDTLS_ERR_SSL_NON_FATAL;
    }

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM) {
        /* Drop unexpected ApplicationData records,
         * except at the beginning of renegotiations */
        if (ssl->in_msgtype == MBEDTLS_SSL_MSG_APPLICATION_DATA &&
            mbedtls_ssl_is_handshake_over(ssl) == 0
#if defined(MBEDTLS_SSL_RENEGOTIATION)
            && !(ssl->renego_status == MBEDTLS_SSL_RENEGOTIATION_IN_PROGRESS &&
                 ssl->state == MBEDTLS_SSL_SERVER_HELLO)
#endif
            ) {
            MBEDTLS_SSL_DEBUG_MSG(1, ("dropping unexpected ApplicationData"));
            return MBEDTLS_ERR_SSL_NON_FATAL;
        }

        if (ssl->handshake != NULL &&
            mbedtls_ssl_is_handshake_over(ssl) == 1) {
            mbedtls_ssl_handshake_wrapup_free_hs_transform(ssl);
        }
    }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

    return 0;
}